

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O0

char * make_bones_id(char *buf,d_level *dlev)

{
  char cVar1;
  boolean bVar2;
  s_level *psVar3;
  char *__s;
  char *local_38;
  s_level *sptr;
  d_level *dlev_local;
  char *buf_local;
  
  cVar1 = dungeons[dlev->dnum].boneid;
  bVar2 = In_quest(dlev);
  if (bVar2 == '\0') {
    local_38 = "0";
  }
  else {
    local_38 = urole.filecode;
  }
  sprintf(buf,"%c%s",(ulong)(uint)(int)cVar1,local_38);
  psVar3 = Is_special(dlev);
  if (psVar3 == (s_level *)0x0) {
    sprintf(buf + 2,".%d",(ulong)(uint)(int)dlev->dlevel);
  }
  else {
    sprintf(buf + 2,".%c",(ulong)(uint)(int)psVar3->boneid);
  }
  __s = eos(buf);
  sprintf(__s,".%ld",u.ubirthday % 5);
  return buf;
}

Assistant:

static char *make_bones_id(char *buf, d_level *dlev)
{
	s_level *sptr;

	sprintf(buf, "%c%s", dungeons[dlev->dnum].boneid,
			In_quest(dlev) ? urole.filecode : "0");
	if ((sptr = Is_special(dlev)) != 0)
	    sprintf(buf+2, ".%c", sptr->boneid);
	else
	    sprintf(buf+2, ".%d", dlev->dlevel);

	/* Simple bones pool by adding a number to the bones filename.
	 * The number must stay the same for the current game. */
	sprintf(eos(buf), ".%ld", u.ubirthday % 5);

	return buf;
}